

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_BoyerMooreFind.h
# Opt level: O0

uint64_t __thiscall
axl::sl::
BoyerMooreFindBase<axl::sl::BoyerMooreDetailsBase<char,_axl::sl::BoyerMooreSkipTablesBase<char>,_false,_256UL>_>
::find(BoyerMooreFindBase<axl::sl::BoyerMooreDetailsBase<char,_axl::sl::BoyerMooreSkipTablesBase<char>,_false,_256UL>_>
       *this,BoyerMooreStateBase<char> *state,C *p,size_t length)

{
  size_t sVar1;
  BoyerMooreStateBase<char> *pBVar2;
  size_t length_00;
  size_t sVar3;
  uint64_t uVar4;
  long in_RCX;
  char *in_RDX;
  BoyerMooreStateBase<char> *in_RSI;
  ArrayRef<char,_axl::sl::ArrayDetails<char>_> *in_RDI;
  uint64_t offset;
  size_t i;
  size_t fullLength;
  BoyerMooreIncrementalAccessorBase<char,_false,_axl::sl::BoyerMooreStateBase<char>_> accessor;
  uint64_t in_stack_ffffffffffffff88;
  char *in_stack_ffffffffffffffb0;
  size_t in_stack_ffffffffffffffb8;
  BoyerMooreFindBase<axl::sl::BoyerMooreDetailsBase<char,_axl::sl::BoyerMooreSkipTablesBase<char>,_false,_256UL>_>
  *in_stack_ffffffffffffffc8;
  BoyerMooreStateBase<char> *local_8;
  
  BoyerMooreIncrementalAccessorBase<char,_false,_axl::sl::BoyerMooreStateBase<char>_>::
  BoyerMooreIncrementalAccessorBase
            ((BoyerMooreIncrementalAccessorBase<char,_false,_axl::sl::BoyerMooreStateBase<char>_> *)
             &stack0xffffffffffffffc8,in_RSI,in_RDX);
  sVar1 = BoyerMooreStateBase<char>::getTailLength((BoyerMooreStateBase<char> *)0x13d950);
  pBVar2 = (BoyerMooreStateBase<char> *)(sVar1 + in_RCX);
  length_00 = BoyerMooreFindBase<axl::sl::BoyerMooreDetailsBase<char,axl::sl::BoyerMooreSkipTablesBase<char>,false,256ul>>
              ::
              findImpl<axl::sl::BoyerMooreIncrementalAccessorBase<char,false,axl::sl::BoyerMooreStateBase<char>>>
                        (in_stack_ffffffffffffffc8,
                         (BoyerMooreIncrementalAccessorBase<char,_false,_axl::sl::BoyerMooreStateBase<char>_>
                          *)pBVar2,in_stack_ffffffffffffffb8,(size_t)in_stack_ffffffffffffffb0);
  sVar1 = length_00;
  sVar3 = ArrayRef<char,_axl::sl::ArrayDetails<char>_>::getCount(in_RDI);
  if (pBVar2 < (BoyerMooreStateBase<char> *)(length_00 + sVar3)) {
    BoyerMooreStateBase<char>::advance<false>(pBVar2,sVar1,in_stack_ffffffffffffffb0,length_00);
    local_8 = (BoyerMooreStateBase<char> *)0xffffffffffffffff;
  }
  else {
    uVar4 = BoyerMooreStateBase<char>::getOffset(in_RSI);
    pBVar2 = (BoyerMooreStateBase<char> *)(uVar4 + sVar1);
    local_8 = pBVar2;
    ArrayRef<char,_axl::sl::ArrayDetails<char>_>::getCount(in_RDI);
    BoyerMooreStateBase<char>::reset(pBVar2,in_stack_ffffffffffffff88);
  }
  return (uint64_t)local_8;
}

Assistant:

uint64_t
	find(
		BoyerMooreStateBase<C>* state,
		const C* p,
		size_t length
	) const {
		ASSERT(state->getPatternLength() == m_pattern.getCount());

		BoyerMooreIncrementalAccessorBase<C, IsReverse> accessor(state, IsReverse ? p + length - 1 : p);
		size_t fullLength = state->getTailLength() + length;
		size_t i = findImpl(accessor, 0, fullLength);
		if (i + m_pattern.getCount() <= fullLength) {
			uint64_t offset = state->getOffset() + i;
			state->reset(offset + m_pattern.getCount());
			return offset;
		}

		state->template advance<IsReverse>(i, p, length);
		return -1;
	}